

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttinterp.c
# Opt level: O0

FT_Bool Compute_Point_Displacement
                  (TT_ExecContext exc,FT_F26Dot6 *x,FT_F26Dot6 *y,TT_GlyphZone zone,FT_UShort *refp)

{
  FT_F26Dot6 a_;
  FT_Long FVar1;
  FT_F26Dot6 d;
  undefined1 local_78 [6];
  FT_UShort p;
  TT_GlyphZoneRec zp;
  FT_UShort *refp_local;
  TT_GlyphZone zone_local;
  FT_F26Dot6 *y_local;
  FT_F26Dot6 *x_local;
  TT_ExecContext exc_local;
  
  zp._56_8_ = refp;
  if ((exc->opcode & 1) == 0) {
    memcpy(local_78,&exc->zp1,0x40);
    d._6_2_ = (exc->GS).rp2;
  }
  else {
    memcpy(local_78,&exc->zp0,0x40);
    d._6_2_ = (exc->GS).rp1;
  }
  if (d._6_2_ < zp.memory._4_2_) {
    memcpy(zone,local_78,0x40);
    *(FT_UShort *)zp._56_8_ = d._6_2_;
    a_ = (*exc->func_project)
                   (exc,zp.org[(int)(uint)d._6_2_].x -
                        *(long *)(zp._8_8_ + (long)(int)(uint)d._6_2_ * 0x10),
                    zp.org[(int)(uint)d._6_2_].y -
                    *(long *)(zp._8_8_ + (long)(int)(uint)d._6_2_ * 0x10 + 8));
    FVar1 = FT_MulDiv(a_,(long)(exc->GS).freeVector.x,exc->F_dot_P);
    *x = FVar1;
    FVar1 = FT_MulDiv(a_,(long)(exc->GS).freeVector.y,exc->F_dot_P);
    *y = FVar1;
    exc_local._7_1_ = '\0';
  }
  else {
    if (exc->pedantic_hinting != '\0') {
      exc->error = 0x86;
    }
    *(undefined2 *)zp._56_8_ = 0;
    exc_local._7_1_ = '\x01';
  }
  return exc_local._7_1_;
}

Assistant:

static FT_Bool
  Compute_Point_Displacement( TT_ExecContext  exc,
                              FT_F26Dot6*     x,
                              FT_F26Dot6*     y,
                              TT_GlyphZone    zone,
                              FT_UShort*      refp )
  {
    TT_GlyphZoneRec  zp;
    FT_UShort        p;
    FT_F26Dot6       d;


    if ( exc->opcode & 1 )
    {
      zp = exc->zp0;
      p  = exc->GS.rp1;
    }
    else
    {
      zp = exc->zp1;
      p  = exc->GS.rp2;
    }

    if ( BOUNDS( p, zp.n_points ) )
    {
      if ( exc->pedantic_hinting )
        exc->error = FT_THROW( Invalid_Reference );
      *refp = 0;
      return FAILURE;
    }

    *zone = zp;
    *refp = p;

    d = PROJECT( zp.cur + p, zp.org + p );

    *x = FT_MulDiv( d, (FT_Long)exc->GS.freeVector.x, exc->F_dot_P );
    *y = FT_MulDiv( d, (FT_Long)exc->GS.freeVector.y, exc->F_dot_P );

    return SUCCESS;
  }